

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaTeX.cpp
# Opt level: O0

string * __thiscall Shell::LaTeX::toString_abi_cxx11_(LaTeX *this,TermList *terms,bool single)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Term *this_00;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string *psVar7;
  byte in_CL;
  LaTeX *in_RDX;
  string *in_RDI;
  size_t start_pos;
  string to;
  string from;
  uint i;
  string template_str;
  Term *trm;
  TermList *t;
  bool first;
  string result;
  undefined1 in_stack_00001e93;
  uint in_stack_00001e94;
  LaTeX *in_stack_00001e98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  TermList *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined2 in_stack_fffffffffffffe54;
  undefined1 in_stack_fffffffffffffe56;
  undefined1 in_stack_fffffffffffffe57;
  string local_170 [4];
  uint in_stack_fffffffffffffe94;
  LaTeX *in_stack_fffffffffffffe98;
  string local_150 [32];
  string local_130 [36];
  uint local_10c;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [20];
  uint in_stack_ffffffffffffff4c;
  string local_a8 [32];
  Term *local_88;
  string local_80 [32];
  LaTeX *local_60;
  byte local_52;
  allocator<char> local_51;
  string local_50 [47];
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  LaTeX *this_01;
  
  bVar1 = in_CL & 1;
  bVar2 = Kernel::TermList::isEmpty((TermList *)0xbc27e1);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe57,
                        CONCAT16(in_stack_fffffffffffffe56,
                                 CONCAT24(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50))),
               in_stack_fffffffffffffe48,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe6);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe57,
                        CONCAT16(in_stack_fffffffffffffe56,
                                 CONCAT24(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50))),
               in_stack_fffffffffffffe48,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    local_60 = in_RDX;
    std::allocator<char>::~allocator(&local_51);
    local_52 = 1;
    this_01 = local_60;
    while (bVar2 = Kernel::TermList::isNonEmpty((TermList *)0xbc28c7), bVar2) {
      if ((local_52 & 1) == 0) {
        std::__cxx11::string::operator+=(local_50,",");
      }
      else {
        local_52 = 0;
      }
      bVar2 = Kernel::TermList::isVar((TermList *)in_stack_fffffffffffffe10);
      if (bVar2) {
        Kernel::TermList::var((TermList *)local_60);
        varToString_abi_cxx11_(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
        std::__cxx11::string::operator+=(local_50,local_80);
        std::__cxx11::string::~string(local_80);
      }
      else {
        this_00 = Kernel::TermList::term((TermList *)0xbc29e9);
        in_stack_fffffffffffffe38 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Kernel::theory;
        local_88 = this_00;
        uVar3 = Kernel::Term::functor(this_00);
        Kernel::Theory::tryGetInterpretedLaTeXName_abi_cxx11_
                  ((Theory *)template_str._M_string_length,template_str._4_4_,
                   (bool)template_str._3_1_,(bool)template_str._2_1_);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          for (local_10c = 0; uVar3 = local_10c, uVar4 = Kernel::Term::arity(local_88),
              uVar3 < uVar4; local_10c = local_10c + 1) {
            Lib::Int::toString_abi_cxx11_(in_stack_ffffffffffffff4c);
            std::operator+((char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
            std::__cxx11::string::~string(local_150);
            in_stack_fffffffffffffe18 = Kernel::Term::nthArgument(local_88,local_10c);
            toString_abi_cxx11_(this_01,(TermList *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                                (bool)in_stack_ffffffffffffffdf);
            while (pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            std::__cxx11::string::find(local_a8,(ulong)local_130),
                  pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0xffffffffffffffff) {
              psVar7 = (string *)std::__cxx11::string::length();
              std::__cxx11::string::replace((ulong)local_a8,(ulong)pbVar6,psVar7);
              std::__cxx11::string::length();
              in_stack_fffffffffffffe10 = pbVar6;
            }
            std::__cxx11::string::~string(local_170);
            std::__cxx11::string::~string(local_130);
          }
          std::__cxx11::string::operator+=(local_50,local_a8);
        }
        else {
          in_stack_fffffffffffffe34 = Kernel::Term::functor(local_88);
          symbolToString_abi_cxx11_(in_stack_00001e98,in_stack_00001e94,(bool)in_stack_00001e93);
          Kernel::Term::args(local_88);
          toString_abi_cxx11_(this_01,(TermList *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                              (bool)in_stack_ffffffffffffffdf);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(uVar3,in_stack_fffffffffffffe40));
          std::__cxx11::string::operator+=(local_50,local_c8);
          std::__cxx11::string::~string(local_c8);
          std::__cxx11::string::~string(local_108);
          std::__cxx11::string::~string(local_e8);
        }
        std::__cxx11::string::~string(local_a8);
      }
      if ((bVar1 & 1) != 0) break;
      local_60 = (LaTeX *)Kernel::TermList::next((TermList *)local_60);
    }
    if ((bVar1 & 1) == 0) {
      std::operator+(in_stack_fffffffffffffe38,
                     (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    }
    else {
      std::__cxx11::string::string((string *)in_RDI,local_50);
    }
    std::__cxx11::string::~string(local_50);
  }
  return in_RDI;
}

Assistant:

std::string LaTeX::toString (TermList* terms,bool single) const
{
  if (terms->isEmpty()) {
    return "";
  }

  std::string result = single ? "" : " (";
  bool first=true;
  TermList* t=terms;
  while(t->isNonEmpty()) {

    if(first){
      first=false;
    }
    else{
        result += ",";
    }

//   if (_map) {
//     std::string result;
//     if (_map->toString(t,*this,result)) {
//       return result;
//     }
//   }
    if(t->isVar()) {
      ASS(t->isOrdinaryVar());
      result += varToString(t->var()); 
    }
    else {
      ASS(t->isTerm());
      Term* trm=t->term();

     //Check if this symbol has an interpreted LaTeX name
     // this should be true for all known interpreted symbols and any recorded symbols
      std::string template_str = theory->tryGetInterpretedLaTeXName(trm->functor(),false);
   
      if(template_str.empty()){
        result += symbolToString(trm->functor(), false) + toString(trm->args());
      }
      else{
        // replace arguments in the template, arg0 replaces a0 etc.
        for(unsigned i=0;i<trm->arity();i++){
          std::string from = "a"+Lib::Int::toString(i);
          std::string to = toString(trm->nthArgument(i),true);
          size_t start_pos = 0;
          while((start_pos = template_str.find(from, start_pos)) != std::string::npos) {
            template_str.replace(start_pos, from.length(), to);
            start_pos += to.length();
          }
        }
        result += template_str;
      }
    }

    if(single) break;
    t=t->next();
  }
  return single? result : result + ")";
}